

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void Server::signal_handler(int dunno)

{
  __pid_t __val;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (dunno == 10) {
    printf("Alive %d\t\tNew %d\t\tDelete %d\n",
           (ulong)(uint)(Client::client_new - Client::client_delete));
    return;
  }
  if (dunno == 2) {
    __val = getpid();
    std::__cxx11::to_string(&local_48,__val);
    std::operator+(&local_68,"/tmp/webed_",&local_48);
    std::operator+(&local_28,&local_68,".sock");
    unlink(local_28._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    exit(0);
  }
  signal_handler();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Server::signal_handler(int dunno) {
    switch (dunno) {
        case SIGUSR1:
            printf("Alive %d\t\tNew %d\t\tDelete %d\n", Client::client_new - Client::client_delete,
                   Client::client_new, Client::client_delete);
            break;
        case SIGINT:
            unlink(("/tmp/webed_" + std::to_string(getpid()) + ".sock").c_str());
            exit(0);
        default:
            IF_NEGATIVE_EXIT(-1);
    }
}